

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

void crnlib::pack_etc1_block_init(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int color;
  ulong uVar14;
  bool bVar15;
  
  lVar7 = 0;
  do {
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        iVar1 = (&g_etc1_inten_tables)[lVar4 * 4 + lVar6];
        uVar14 = 0;
        do {
          uVar11 = 0xffffffff;
          uVar3 = 0;
          uVar8 = 0;
          uVar12 = 0;
          uVar5 = 1;
          do {
            uVar9 = uVar5 - 1;
            if (lVar7 == 0) {
              uVar10 = uVar3 | uVar9;
            }
            else {
              uVar10 = uVar9 >> 2 | uVar8;
            }
            uVar10 = uVar10 + iVar1;
            if (0xfe < (int)uVar10) {
              uVar10 = 0xff;
            }
            if ((int)uVar10 < 1) {
              uVar10 = 0;
            }
            uVar13 = uVar10 - (int)uVar14;
            uVar2 = -uVar13;
            if (0 < (int)uVar13) {
              uVar2 = uVar13;
            }
            bVar15 = uVar2 < uVar11;
            if (bVar15) {
              uVar12 = uVar9;
              uVar11 = uVar2;
            }
            if (uVar14 == uVar10 && bVar15) break;
            uVar8 = uVar8 + 8;
            uVar3 = uVar3 + 0x10;
            bVar15 = uVar5 < (uint)(lVar7 != 0) * 0x10 + 0x10;
            uVar5 = uVar5 + 1;
          } while (bVar15);
          *(ushort *)
           (g_etc1_inverse_lookup + uVar14 * 2 + (lVar6 * 0x10 + lVar4 * 2 + lVar7) * 0x200) =
               (ushort)uVar12 | (ushort)(uVar11 << 8);
          uVar14 = uVar14 + 1;
        } while (uVar14 != 0x100);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    bVar15 = lVar7 != 0;
    lVar7 = lVar7 + 1;
    if (bVar15) {
      return;
    }
  } while( true );
}

Assistant:

void pack_etc1_block_init() {
  for (uint diff = 0; diff < 2; diff++) {
    const uint limit = diff ? 32 : 16;

    for (uint inten = 0; inten < 8; inten++) {
      for (uint selector = 0; selector < 4; selector++) {
        const uint inverse_table_index = diff + (inten << 1) + (selector << 4);
        for (int color = 0; color < 256; color++) {
          uint best_error = cUINT32_MAX, best_packed_c = 0;
          for (uint packed_c = 0; packed_c < limit; packed_c++) {
            int v = etc1_decode_value(diff, inten, selector, packed_c);
            uint err = labs(v - color);
            if (err < best_error) {
              best_error = err;
              best_packed_c = packed_c;
              if (!best_error)
                break;
            }
          }
          CRNLIB_ASSERT(best_error <= 255);
          g_etc1_inverse_lookup[inverse_table_index][color] = static_cast<uint16>(best_packed_c | (best_error << 8));
        }
      }
    }
  }
}